

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qibustypes.cpp
# Opt level: O3

void __thiscall QIBusSerializable::deserializeFrom(QIBusSerializable *this,QDBusArgument *argument)

{
  long lVar1;
  char cVar2;
  bool bVar3;
  QMetaType QVar4;
  long lVar5;
  QDBusArgumentPrivate *pQVar6;
  long in_FS_OFFSET;
  QString local_b8;
  QDBusArgument local_98;
  TryEmplaceResult local_90;
  QDBusArgumentPrivate *local_78 [3];
  byte local_60;
  undefined7 uStack_5f;
  anon_union_24_3_e3d07ef4_for_data local_58;
  undefined8 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QDBusArgument::operator>>(argument,&this->name);
  QDBusArgument::beginMap();
  cVar2 = QDBusArgument::atEnd();
  if (cVar2 == '\0') {
    do {
      QDBusArgument::beginMapEntry();
      local_b8.d.size = 0;
      local_b8.d.d = (Data *)0x0;
      local_b8.d.ptr = (char16_t *)0x0;
      local_58._16_8_ = 0;
      local_58.shared = (PrivateShared *)0x0;
      local_58._8_8_ = 0;
      local_40 = 2;
      QDBusArgument::operator>>(argument,&local_b8);
      QDBusArgument::operator>>(argument,(QDBusVariant *)&local_58);
      QDBusArgument::endMapEntry();
      QVariant::QVariant((QVariant *)local_78,(QVariant *)&local_58);
      local_90.iterator.i.d =
           (Data<QHashPrivate::Node<QString,_QDBusArgument>_> *)
           &QtPrivate::QMetaTypeInterfaceWrapper<QDBusArgument>::metaType;
      local_98.d = (QDBusArgumentPrivate *)(CONCAT71(uStack_5f,local_60) & 0xfffffffffffffffc);
      bVar3 = comparesEqual((QMetaType *)&local_98,(QMetaType *)&local_90);
      if (bVar3) {
        if ((local_60 & 1) == 0) {
          local_98.d = local_78[0];
          local_78[0] = (QDBusArgumentPrivate *)0x0;
        }
        else {
          pQVar6 = local_78[0] + *(int *)(local_78[0] + 4);
          if (*(int *)local_78[0] == 1) {
            local_98.d = *pQVar6;
            *(undefined8 *)pQVar6 = 0;
          }
          else {
            QDBusArgument::QDBusArgument(&local_98,(QDBusArgument *)pQVar6);
          }
        }
      }
      else {
        local_98.d = (QDBusArgumentPrivate *)0xaaaaaaaaaaaaaaaa;
        QDBusArgument::QDBusArgument(&local_98);
        QVar4.d_ptr = (QMetaTypeInterface *)QVariant::metaType();
        pQVar6 = (QDBusArgumentPrivate *)local_78;
        if ((local_60 & 1) != 0) {
          pQVar6 = local_78[0] + *(int *)(local_78[0] + 4);
        }
        QMetaType::convert(QVar4,pQVar6,(QMetaType)local_90.iterator.i.d,&local_98);
      }
      QHash<QString,QDBusArgument>::tryEmplace_impl<QString_const&>
                (&local_90,&this->attachments,&local_b8);
      lVar5 = (local_90.iterator.i.bucket >> 7) * 0x90;
      lVar1 = *(long *)((long)(local_90.iterator.i.d)->spans + lVar5 + 0x80);
      lVar5 = (ulong)*(byte *)((long)(local_90.iterator.i.d)->spans +
                              (ulong)((uint)local_90.iterator.i.bucket & 0x7f) + lVar5) * 0x20;
      pQVar6 = *(QDBusArgumentPrivate **)(lVar1 + 0x18 + lVar5);
      *(QDBusArgumentPrivate **)(lVar1 + 0x18 + lVar5) = local_98.d;
      local_98.d = pQVar6;
      QDBusArgument::~QDBusArgument(&local_98);
      QVariant::~QVariant((QVariant *)local_78);
      QVariant::~QVariant((QVariant *)&local_58);
      if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,2,0x10);
        }
      }
      cVar2 = QDBusArgument::atEnd();
    } while (cVar2 == '\0');
  }
  QDBusArgument::endMap();
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QIBusSerializable::deserializeFrom(const QDBusArgument &argument)
{
    argument >> name;

    argument.beginMap();
    while (!argument.atEnd()) {
        argument.beginMapEntry();
        QString key;
        QDBusVariant value;
        argument >> key;
        argument >> value;
        argument.endMapEntry();
        attachments[key] = qvariant_cast<QDBusArgument>(value.variant());
    }
    argument.endMap();
}